

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Var::move_linked_to(Var *this,Var *new_var)

{
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  *this_00;
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  long lVar4;
  Var *pVVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  shared_ptr<kratos::VarSlice> *slice;
  undefined4 extraout_var;
  pointer psVar10;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  _Var11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var12;
  VarException *pVVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer psVar14;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  Var *local_98;
  Var *local_90;
  Var *local_88;
  string local_80;
  __weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  allocator_type local_31;
  
  iVar6 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])(new_var);
  if ((Var *)CONCAT44(extraout_var,iVar6) != this) {
    iVar6 = (*(new_var->super_IRNode)._vptr_IRNode[7])(new_var);
    iVar7 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
    local_90 = new_var;
    if (iVar6 != iVar7) {
      pVVar13 = (VarException *)__cxa_allocate_exception(0x10);
      uVar8 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
      uVar9 = (*(new_var->super_IRNode)._vptr_IRNode[7])(new_var);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)uVar8;
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar9;
      format_str.size_ = 0x22;
      format_str.data_ = (char *)0x55;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_80,
                 (detail *)
                 "Try to move linked variable to a variable that doesn\'t match width. Need {0}, got {1}"
                 ,format_str,args);
      __l._M_len = 2;
      __l._M_array = (iterator)&local_98;
      local_98 = this;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l,&local_31);
      VarException::VarException(pVVar13,&local_80,&local_58);
      __cxa_throw(pVVar13,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (new_var->is_signed_ != this->is_signed_) {
      pVVar13 = (VarException *)__cxa_allocate_exception(0x10);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x248c9d;
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x248c9d;
      if (this->is_signed_ != false) {
        local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x248c9f;
      }
      if (new_var->is_signed_ != false) {
        local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x248c9f;
      }
      format_str_00.size_ = 0xcc;
      format_str_00.data_ = (char *)0x54;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_80,
                 (detail *)
                 "Try to move linked variable to a variable that doesn\'t match sign. Need {0}, got {1}"
                 ,format_str_00,args_00);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_98;
      local_98 = this;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l_00,&local_31);
      VarException::VarException(pVVar13,&local_80,&local_58);
      __cxa_throw(pVVar13,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar1 = (this->slices_).
             super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar10 = (this->slices_).
                   super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar1;
        psVar10 = psVar10 + 1) {
      ((psVar10->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      parent_var = new_var;
    }
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarSlice>*,std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>>,void>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)&local_80,
               (this->slices_).
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->slices_).
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_98);
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(new_var->slices_).
                  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(new_var->slices_).
                  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(new_var->slices_).
                  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (new_var->slices_).
    super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80._M_dataplus._M_p;
    (new_var->slices_).
    super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_80._M_string_length;
    (new_var->slices_).
    super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_80.field_2._M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)0x0;
    local_80._M_string_length = 0;
    local_80.field_2._M_allocated_capacity = 0;
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             *)&local_58);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             *)&local_80);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    clear(&this->slices_);
    psVar14 = (this->concat_vars_).
              super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->concat_vars_).
             super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_88 = this;
    if (psVar14 != psVar2) {
      local_60 = (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<kratos::Var>;
      do {
        peVar3 = (psVar14->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        (*(peVar3->super_Expr).super_Var.super_IRNode._vptr_IRNode[0x14])(peVar3,new_var);
        peVar3 = (psVar14->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,local_60);
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_80,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &new_var->super_enable_shared_from_this<kratos::Var>);
        local_98 = (Var *)local_58.
                          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_equals_val<kratos::Var*const>>
                           ((peVar3->vars_).
                            super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (peVar3->vars_).
                            super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&local_98);
        if (_Var11._M_current !=
            (peVar3->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          *_Var11._M_current = (Var *)local_80._M_dataplus._M_p;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_58.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_58.
                     super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        psVar14 = psVar14 + 1;
      } while (psVar14 != psVar2);
    }
    pVVar5 = local_88;
    this_00 = &local_88->concat_vars_;
    std::
    vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarConcat>*,std::vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>>,void>
              ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                *)&local_80,
               (local_88->concat_vars_).
               super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (local_88->concat_vars_).
               super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_98);
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(new_var->concat_vars_).
                  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(new_var->concat_vars_).
                  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(new_var->concat_vars_).
                  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (new_var->concat_vars_).
    super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80._M_dataplus._M_p;
    (new_var->concat_vars_).
    super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_80._M_string_length;
    (new_var->concat_vars_).
    super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_80.field_2._M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)0x0;
    local_80._M_string_length = 0;
    local_80.field_2._M_allocated_capacity = 0;
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::~vector((vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               *)&local_58);
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::~vector((vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               *)&local_80);
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::clear(this_00);
    local_60 = (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&pVVar5->casted_;
    for (p_Var12 = (pVVar5->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var12 != &(pVVar5->casted_)._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
      lVar4 = *(long *)(p_Var12 + 1);
      iVar6 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])(new_var);
      *(ulong *)(lVar4 + 0x278) = CONCAT44(extraout_var_00,iVar6);
      iVar6 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])(new_var);
      std::
      _Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
      ::_M_emplace_unique<std::shared_ptr<kratos::VarCasted>const&>
                ((_Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                  *)(CONCAT44(extraout_var_01,iVar6) + 0x208),
                 (shared_ptr<kratos::VarCasted> *)(p_Var12 + 1));
    }
    std::
    _Rb_tree<std::shared_ptr<kratos::VarCasted>,_std::shared_ptr<kratos::VarCasted>,_std::_Identity<std::shared_ptr<kratos::VarCasted>_>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
    ::clear((_Rb_tree<std::shared_ptr<kratos::VarCasted>,_std::shared_ptr<kratos::VarCasted>,_std::_Identity<std::shared_ptr<kratos::VarCasted>_>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
             *)local_60);
  }
  return;
}

Assistant:

void Var::move_linked_to(kratos::Var *new_var) {
    if (this == new_var->get_var_root_parent()) return;
    // this one doesn't do much checking
    // user code code should check instead
    if (new_var->width() != width()) {
        throw VarException(::format("Try to move linked variable to a variable that "
                                    "doesn't match width. Need {0}, got {1}",
                                    width(), new_var->width()),
                           {this, new_var});
    }
    if (new_var->is_signed() != is_signed()) {
        throw VarException(::format("Try to move linked variable to a variable that "
                                    "doesn't match sign. Need {0}, got {1}",
                                    is_signed() ? "signed" : "unsigned",
                                    new_var->is_signed() ? "signed" : "unsigned"),
                           {this, new_var});
    }
    // move all references held in var to the new var
    // and change the parents
    for (auto &slice : slices_) {
        slice->set_parent(new_var);
    }
    new_var->slices_ = std::vector(slices_.begin(), slices_.end());
    slices_.clear();

    // change concat'ed vars
    // we use overloaded ones
    for (auto const &concat : concat_vars_) {
        concat->move_linked_to(new_var);
        concat->replace_var(shared_from_this(), new_var->shared_from_this());
    }
    new_var->concat_vars_ =
        std::vector<std::shared_ptr<VarConcat>>(concat_vars_.begin(), concat_vars_.end());
    concat_vars_.clear();

    // casted
    for (auto const &var : casted_) {
        var->set_parent(new_var->get_var_root_parent());
        new_var->get_var_root_parent()->casted_.emplace(var);
    }
    casted_.clear();
}